

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O2

void __thiscall QPDFTokenizer::Token::Token(Token *this)

{
  this->type = tt_bad;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  (this->raw_value)._M_dataplus._M_p = (pointer)&(this->raw_value).field_2;
  (this->raw_value)._M_string_length = 0;
  (this->raw_value).field_2._M_local_buf[0] = '\0';
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Token() :
            type(tt_bad)
        {
        }